

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O1

bool fs_is_fifo(string_view path)

{
  char cVar1;
  bool bVar2;
  error_code ec;
  error_code local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  path local_40;
  
  local_60._M_value = 0;
  local_60._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_50,auto_format);
  cVar1 = std::filesystem::status(&local_40,&local_60);
  bVar2 = local_60._M_value == 0;
  std::filesystem::__cxx11::path::~path(&local_40);
  return bVar2 && cVar1 == '\x06';
}

Assistant:

bool
fs_is_fifo(std::string_view path)
{
  // mkfifo() or CreateNamedPipe()
  bool ok;

#if defined(_WIN32)
  ok = fs_win32_is_type(path, FILE_TYPE_PIPE);
#elif defined(HAVE_CXX_FILESYSTEM)
  std::error_code ec;
  ok = std::filesystem::is_fifo(path, ec) && !ec;
#else
  ok = S_ISFIFO(fs_st_mode(path));
#endif

  return ok;
}